

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void detachFunc(sqlite3_context *context,int NotUsed,sqlite3_value **argv)

{
  int iVar1;
  sqlite3 *db;
  sqlite3 *db_00;
  Vdbe *p;
  sqlite3_mutex *psVar2;
  long lVar3;
  int iVar4;
  char *pcVar5;
  long *plVar6;
  sqlite3_mutex **ppsVar7;
  ulong uVar8;
  char *zName;
  char zErr [128];
  char local_b8 [136];
  
  pcVar5 = (char *)sqlite3ValueText(*argv,'\x01');
  zName = "";
  if (pcVar5 != (char *)0x0) {
    zName = pcVar5;
  }
  db = context->pOut->db;
  iVar1 = db->nDb;
  if (0 < (long)iVar1) {
    db_00 = (sqlite3 *)db->aDb;
    ppsVar7 = &db_00->mutex;
    uVar8 = 0;
    do {
      p = (Vdbe *)ppsVar7[-2];
      if (p != (Vdbe *)0x0) {
        iVar4 = sqlite3DbIsNamed(db_00,(int)uVar8,zName);
        if (iVar4 != 0) {
          if (uVar8 < 2) {
            pcVar5 = "cannot detach database %s";
          }
          else {
            pcVar5 = "database %s is locked";
            if ((*(char *)&p->pVNext == '\0') && (*(int *)&p->pParse == 0)) {
              plVar6 = *(long **)(db_00->lastRowid + 0x40);
              if (plVar6 != (long *)0x0) {
                psVar2 = *ppsVar7;
                do {
                  lVar3 = plVar6[2];
                  if (*(sqlite3_mutex **)(lVar3 + 0x30) == psVar2) {
                    *(undefined8 *)(lVar3 + 0x30) = *(undefined8 *)(lVar3 + 0x28);
                  }
                  plVar6 = (long *)*plVar6;
                } while (plVar6 != (long *)0x0);
              }
              sqlite3BtreeClose((Btree *)p);
              ppsVar7[-2] = (sqlite3_mutex *)0x0;
              *ppsVar7 = (sqlite3_mutex *)0x0;
              sqlite3CollapseDatabaseArray(db);
              return;
            }
          }
          goto LAB_001b4f86;
        }
      }
      uVar8 = uVar8 + 1;
      ppsVar7 = ppsVar7 + 4;
    } while ((long)iVar1 != uVar8);
  }
  pcVar5 = "no such database: %s";
LAB_001b4f86:
  sqlite3_snprintf(0x80,local_b8,pcVar5,zName);
  context->isError = 1;
  sqlite3VdbeMemSetStr(context->pOut,local_b8,-1,'\x01',(_func_void_void_ptr *)0xffffffffffffffff);
  return;
}

Assistant:

static void detachFunc(
  sqlite3_context *context,
  int NotUsed,
  sqlite3_value **argv
){
  const char *zName = (const char *)sqlite3_value_text(argv[0]);
  sqlite3 *db = sqlite3_context_db_handle(context);
  int i;
  Db *pDb = 0;
  HashElem *pEntry;
  char zErr[128];

  UNUSED_PARAMETER(NotUsed);

  if( zName==0 ) zName = "";
  for(i=0; i<db->nDb; i++){
    pDb = &db->aDb[i];
    if( pDb->pBt==0 ) continue;
    if( sqlite3DbIsNamed(db, i, zName) ) break;
  }

  if( i>=db->nDb ){
    sqlite3_snprintf(sizeof(zErr),zErr, "no such database: %s", zName);
    goto detach_error;
  }
  if( i<2 ){
    sqlite3_snprintf(sizeof(zErr),zErr, "cannot detach database %s", zName);
    goto detach_error;
  }
  if( sqlite3BtreeTxnState(pDb->pBt)!=SQLITE_TXN_NONE
   || sqlite3BtreeIsInBackup(pDb->pBt)
  ){
    sqlite3_snprintf(sizeof(zErr),zErr, "database %s is locked", zName);
    goto detach_error;
  }

  /* If any TEMP triggers reference the schema being detached, move those
  ** triggers to reference the TEMP schema itself. */
  assert( db->aDb[1].pSchema );
  pEntry = sqliteHashFirst(&db->aDb[1].pSchema->trigHash);
  while( pEntry ){
    Trigger *pTrig = (Trigger*)sqliteHashData(pEntry);
    if( pTrig->pTabSchema==pDb->pSchema ){
      pTrig->pTabSchema = pTrig->pSchema;
    }
    pEntry = sqliteHashNext(pEntry);
  }

  sqlite3BtreeClose(pDb->pBt);
  pDb->pBt = 0;
  pDb->pSchema = 0;
  sqlite3CollapseDatabaseArray(db);
  return;

detach_error:
  sqlite3_result_error(context, zErr, -1);
}